

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_int16 *
ma_dr_flac__full_read_and_close_s16
          (ma_dr_flac *pFlac,uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalPCMFrameCountOut)

{
  ma_allocation_callbacks *pAllocationCallbacks;
  _func_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  size_t sVar4;
  ma_int16 *pmVar5;
  ma_uint64 mVar6;
  ma_uint64 mVar7;
  ma_int16 *pmVar8;
  long lVar9;
  ma_uint64 mVar10;
  size_t sVar11;
  bool bVar12;
  ma_int16 buffer [4096];
  ma_int16 *local_2070;
  ma_int16 local_2038 [4100];
  
  if (pFlac->totalPCMFrameCount == 0) {
    pAllocationCallbacks = &pFlac->allocationCallbacks;
    p_Var1 = (pFlac->allocationCallbacks).onMalloc;
    if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
      p_Var2 = (pFlac->allocationCallbacks).onRealloc;
      if (p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        local_2070 = (ma_int16 *)0x0;
      }
      else {
        local_2070 = (ma_int16 *)(*p_Var2)((void *)0x0,0x2000,pAllocationCallbacks->pUserData);
      }
    }
    else {
      local_2070 = (ma_int16 *)(*p_Var1)(0x2000,pAllocationCallbacks->pUserData);
    }
    if (local_2070 == (ma_int16 *)0x0) {
      local_2070 = (ma_int16 *)0x0;
      bVar12 = false;
      mVar6 = 0;
    }
    else {
      mVar7 = ma_dr_flac_read_pcm_frames_s16
                        (pFlac,SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) /
                                      ZEXT116(pFlac->channels),0),local_2038);
      if (mVar7 == 0) {
        sVar11 = 0x2000;
        mVar10 = 0;
      }
      else {
        sVar11 = 0x2000;
        mVar6 = 0;
        do {
          mVar10 = mVar7 + mVar6;
          if (sVar11 < pFlac->channels * mVar10 * 2) {
            pmVar8 = (ma_int16 *)
                     ma_dr_flac__realloc_from_callbacks
                               (local_2070,sVar11 * 2,sVar11,pAllocationCallbacks);
            bVar12 = pmVar8 != (ma_int16 *)0x0;
            sVar4 = sVar11 * 2;
            pmVar5 = pmVar8;
            if (((!bVar12) && (sVar4 = sVar11, pmVar5 = local_2070, local_2070 != (ma_int16 *)0x0))
               && (p_Var3 = (pFlac->allocationCallbacks).onFree,
                  p_Var3 != (_func_void_void_ptr_void_ptr *)0x0)) {
              (*p_Var3)(local_2070,pAllocationCallbacks->pUserData);
            }
            local_2070 = pmVar5;
            sVar11 = sVar4;
            if (pmVar8 == (ma_int16 *)0x0) goto LAB_0017946d;
          }
          memcpy(local_2070 + mVar6 * pFlac->channels,local_2038,mVar7 * pFlac->channels * 2);
          mVar7 = ma_dr_flac_read_pcm_frames_s16
                            (pFlac,SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) /
                                          ZEXT116(pFlac->channels),0),local_2038);
          mVar6 = mVar10;
        } while (mVar7 != 0);
      }
      lVar9 = pFlac->channels * mVar10;
      memset(local_2070 + lVar9,0,sVar11 + lVar9 * -2);
      bVar12 = true;
      mVar6 = mVar10;
    }
LAB_0017946d:
    if (!bVar12) goto LAB_00179475;
  }
  else {
    sVar11 = (ulong)pFlac->channels * pFlac->totalPCMFrameCount * 2;
    p_Var1 = (pFlac->allocationCallbacks).onMalloc;
    if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
      p_Var2 = (pFlac->allocationCallbacks).onRealloc;
      if (p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        local_2070 = (ma_int16 *)0x0;
      }
      else {
        local_2070 = (ma_int16 *)
                     (*p_Var2)((void *)0x0,sVar11,(pFlac->allocationCallbacks).pUserData);
      }
    }
    else {
      local_2070 = (ma_int16 *)(*p_Var1)(sVar11,(pFlac->allocationCallbacks).pUserData);
    }
    if (local_2070 == (ma_int16 *)0x0) {
LAB_00179475:
      local_2070 = (ma_int16 *)0x0;
      goto LAB_00179477;
    }
    mVar6 = ma_dr_flac_read_pcm_frames_s16(pFlac,pFlac->totalPCMFrameCount,local_2070);
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = pFlac->sampleRate;
  }
  if (channelsOut != (uint *)0x0) {
    *channelsOut = (uint)pFlac->channels;
  }
  if (totalPCMFrameCountOut != (ma_uint64 *)0x0) {
    *totalPCMFrameCountOut = mVar6;
  }
LAB_00179477:
  ma_dr_flac_close(pFlac);
  return local_2070;
}

Assistant:

ma_int32* ma_dr_flac_open_and_read_pcm_frames_s32(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalPCMFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalPCMFrameCountOut) {
        *totalPCMFrameCountOut = 0;
    }
    pFlac = ma_dr_flac_open(onRead, onSeek, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s32(pFlac, channelsOut, sampleRateOut, totalPCMFrameCountOut);
}